

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Planner.cpp
# Opt level: O3

void __thiscall Planner::Planner(Planner *this,Vec3i World_Size_)

{
  undefined1 local_188 [312];
  function<double_(Vec3i,_Vec3i)> local_50;
  
  this->_vptr_Planner = (_func_int **)&PTR__Planner_00109d28;
  *(undefined8 *)&(this->heuristic).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->heuristic).super__Function_base._M_functor + 8) = 0;
  (this->heuristic).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->heuristic)._M_invoker = (_Invoker_type)0x0;
  (this->direction).super__Vector_base<Vec3i,_std::allocator<Vec3i>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->direction).super__Vector_base<Vec3i,_std::allocator<Vec3i>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->direction).super__Vector_base<Vec3i,_std::allocator<Vec3i>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->walls).super__Vector_base<Vec3i,_std::allocator<Vec3i>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->walls).super__Vector_base<Vec3i,_std::allocator<Vec3i>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->walls).super__Vector_base<Vec3i,_std::allocator<Vec3i>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_50.super__Function_base._M_functor._8_8_ = 0;
  local_50.super__Function_base._M_functor._M_unused._M_object = Euclidean;
  local_50._M_invoker =
       std::_Function_handler<double_(Vec3i,_Vec3i),_double_(*)(Vec3i,_Vec3i)>::_M_invoke;
  local_50.super__Function_base._M_manager =
       std::_Function_handler<double_(Vec3i,_Vec3i),_double_(*)(Vec3i,_Vec3i)>::_M_manager;
  Set_Heuristic(this,&local_50);
  if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_50.super__Function_base._M_manager)
              ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
  }
  memcpy(local_188,&DAT_001071f8,0x138);
  std::vector<Vec3i,std::allocator<Vec3i>>::_M_assign_aux<Vec3i_const*>
            ((vector<Vec3i,std::allocator<Vec3i>> *)&this->direction,local_188,&local_50);
  (this->World_Size).x = (int)World_Size_._0_8_;
  (this->World_Size).y = (int)((ulong)World_Size_._0_8_ >> 0x20);
  (this->World_Size).z = World_Size_.z;
  return;
}

Assistant:

Planner::Planner(Vec3i World_Size_) {
  Set_Heuristic(&Planner::Euclidean);  ///< Set default heuristic to Euclidean
  direction = {
    { 0 , 0 , 1}, {0 , 1, 0}, {1, 0, 0}, {0, 0, -1},
    { 0, -1, 0}, {-1, 0, 0}, {0 , 1, 1}, {1, 0, 1},
    { 1, 1, 0}, {0, -1, -1}, {-1, 0, -1}, {-1, -1, 0},
    { 0, 1, -1}, {0, -1, 1}, {1, 0, -1}, {-1, 0, 1},
    { 1, -1, 0}, {-1, 1, 0}, {1, 1, -1}, {1, -1, 1},
    { -1, 1, 1}, {1, -1, -1}, {-1, -1, 1}, {-1, 1, -1},
    { 1, 1, 1}, {-1, -1, -1}
  };
  World_Size = World_Size_;
}